

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_tostring.c
# Opt level: O1

char * mpt_data_tostring(void **from,mpt_type_t type,size_t *len)

{
  size_t sVar1;
  long lVar2;
  size_t sVar3;
  void *pvVar4;
  int *piVar5;
  long *plVar6;
  char *pcVar7;
  
  if ((long)type < 0x73) {
    if (type != 0xb) {
      if ((type == 0x43) && (plVar6 = (long *)*from, plVar6 != (long *)0x0)) {
        pcVar7 = (char *)*plVar6;
        if (pcVar7 == (char *)0x0) {
          if (plVar6[1] != 0) goto LAB_00110007;
          pcVar7 = "";
        }
        sVar1 = plVar6[1];
        if (len == (size_t *)0x0) {
          if ((sVar1 == 0) || (pcVar7[sVar1 - 1] != '\0')) goto LAB_00110007;
        }
        else {
          *len = sVar1;
        }
        *from = plVar6 + 2;
        return pcVar7;
      }
      goto LAB_00110007;
    }
  }
  else if (type != 0x802) {
    if (type != 0x73) goto LAB_00110007;
    plVar6 = (long *)*from;
    if ((plVar6 == (long *)0x0) || (pcVar7 = (char *)*plVar6, pcVar7 == (char *)0x0)) {
      pcVar7 = "";
    }
    if (len != (size_t *)0x0) {
      sVar3 = strlen(pcVar7);
      *len = sVar3;
    }
    if (plVar6 == (long *)0x0) {
      return pcVar7;
    }
    goto LAB_0010ffb8;
  }
  plVar6 = (long *)*from;
  if (plVar6 != (long *)0x0) {
    lVar2 = *plVar6;
    if ((lVar2 == 0) ||
       ((mpt_data_tostring::traits == (mpt_type_traits *)0x0 &&
        (mpt_data_tostring::traits = mpt_type_traits(99),
        mpt_data_tostring::traits == (mpt_type_traits *)0x0)))) {
      piVar5 = __errno_location();
      *piVar5 = 0x5f;
      return (char *)0x0;
    }
    if (*(mpt_type_traits **)(lVar2 + 8) == mpt_data_tostring::traits) {
      pcVar7 = (char *)(lVar2 + 0x20);
      sVar3 = *(size_t *)(lVar2 + 0x18);
      if (len == (size_t *)0x0) {
        if (sVar3 == 0) {
          pcVar7 = "";
        }
        else {
          pvVar4 = memchr(pcVar7,0,sVar3);
          if (pvVar4 == (void *)0x0) goto LAB_00110007;
        }
      }
      else {
        *len = sVar3;
      }
LAB_0010ffb8:
      *from = plVar6 + 1;
      return pcVar7;
    }
  }
LAB_00110007:
  piVar5 = __errno_location();
  *piVar5 = 0x16;
  return (char *)0x0;
}

Assistant:

extern const char *mpt_data_tostring(const void **from, MPT_TYPE(type) type, size_t *len)
{
	static const char def[] = "\0";
	const char *base;
	
	/* simple string pointer */
	if (type == 's') {
		const char * const *txt = *from;
		if (!txt || !(base = *txt)) {
			base = def;
		}
		if (len) {
			*len = strlen(base);
		}
		if (txt) {
			*from = txt + 1;
		}
		return base;
	}
	/* text buffer (pointer or tracked reference) */
	if (type == MPT_ENUM(TypeArray)
	 || type == MPT_ENUM(TypeBufferPtr)) {
		static const MPT_STRUCT(type_traits) *traits= 0;
		const MPT_STRUCT(array) *arr;
		const MPT_STRUCT(buffer) *b;
		
		if (!(arr = *from)) {
			errno = EINVAL;
			return 0;
		}
		if (!(b = arr->_buf)) {
			errno = ENOTSUP;
			return 0;
		}
		/* initialize traits binding */
		if (!traits && (!(traits = mpt_type_traits('c')))) {
			errno = ENOTSUP;
			return 0;
		}
		if (b->_content_traits != traits) {
			errno = EINVAL;
			return 0;
		}
		base = (const char *) (b + 1);
		if (len) {
			*len = b->_used;
		}
		else if (!b->_used) {
			base = def;
		}
		else if (!memchr(base, 0, b->_used)) {
			errno = EINVAL;
			return 0;
		}
		*from = arr + 1;
		return base;
	}
	/* vector data with text content */
	if (type == MPT_type_toVector('c')) {
		const struct iovec *vec = *from;
		
		if (!vec) {
			errno = EINVAL;
			return 0;
		}
		if (!(base = vec->iov_base)) {
			if (vec->iov_len) {
				errno = EINVAL;
				return 0;
			}
			base = def;
		}
		if (len) {
			*len = vec->iov_len;
		}
		else if (!vec->iov_len || base[vec->iov_len - 1]) {
			errno = EINVAL;
			return 0;
		}
		*from = vec + 1;
		return base;
	}
	errno = EINVAL;
	return 0;
}